

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O2

void __thiscall pbrt::LightHandle::PDF_Le(LightHandle *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  ulong uVar1;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  undefined8 unaff_RBX;
  GoniometricLight *this_00;
  PortalImageInfiniteLight *this_01;
  uint uVar5;
  Float FVar6;
  undefined1 auVar7 [16];
  undefined8 uVar12;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 in_ZMM0 [64];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Vector3<float> VVar17;
  Point3<float> PVar18;
  undefined1 auStack_38 [8];
  Vector3f VStack_30;
  undefined1 auVar13 [56];
  undefined1 extraout_var [56];
  
  auVar13 = in_ZMM0._8_56_;
  uVar12 = in_ZMM0._8_8_;
  uVar1 = (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  uVar2 = (ushort)(uVar1 >> 0x30);
  uVar4 = (uint)uVar2;
  if (4 < uVar1 >> 0x30) {
    uVar5 = uVar2 - 4;
    if (uVar5 < 3) {
      if (uVar5 == 2) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.h"
                 ,0x1f0,"Shouldn\'t be called for area lights");
      }
      SpotLight::PDF_Le((SpotLight *)(uVar1 & 0xffffffffffff),ray,pdfPos,pdfDir);
      return;
    }
    this_01 = (PortalImageInfiniteLight *)(uVar1 & 0xffffffffffff);
    if (1 < uVar4 - 6) {
      if (uVar4 - 6 == 2) {
        stack0xffffffffffffffe0 = unaff_RBX;
        VVar17 = Transform::ApplyInverse<float>(&(this_01->super_LightBase).renderFromLight,&ray->d)
        ;
        auVar7._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
        auVar7._8_4_ = (uint)uVar12 ^ 0x80000000;
        auVar7._12_4_ = (uint)((ulong)uVar12 >> 0x20) ^ 0x80000000;
        VStack_30.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar7);
        VStack_30.super_Tuple3<pbrt::Vector3,_float>.z =
             -VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar11._0_8_ = EqualAreaSphereToSquare((Vector3f *)(auStack_38 + 8));
        auVar11._8_56_ = extraout_var;
        auStack_38 = (undefined1  [8])vmovlps_avx(auVar11._0_16_);
        FVar6 = PiecewiseConstant2D::PDF
                          ((PiecewiseConstant2D *)
                           &(this_01->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.y,
                           (Point2f *)auStack_38);
        *pdfDir = FVar6 / 12.566371;
        fVar14 = (this_01->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.z;
        *pdfPos = 1.0 / (fVar14 * fVar14 * 3.1415927);
        return;
      }
      PortalImageInfiniteLight::PDF_Le(this_01,ray,pdfPos,pdfDir);
      return;
    }
    *pdfDir = 0.07957747;
    fVar14 = *(float *)&(this_01->image).channelNames.ptr;
    *pdfPos = 1.0 / (fVar14 * fVar14 * 3.1415927);
    return;
  }
  if (uVar4 < 3) {
    if (uVar4 != 2) {
      *pdfPos = 0.0;
      *pdfDir = 0.07957747;
      return;
    }
    fVar14 = *(float *)((uVar1 & 0xffffffffffff) + 0xd0);
    *pdfPos = 1.0 / (fVar14 * fVar14 * 3.1415927);
    *pdfDir = 0.0;
    return;
  }
  this_00 = (GoniometricLight *)(uVar1 & 0xffffffffffff);
  if ((uVar4 & 6) == 2) {
    *pdfPos = 0.0;
    VVar17 = Transform::ApplyInverse<float>(&(this_00->super_LightBase).renderFromLight,&ray->d);
    VStack_30.super_Tuple3<pbrt::Vector3,_float>.x = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar8._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar13;
    auStack_38 = (undefined1  [8])vmovlps_avx(auVar8._0_16_);
    VVar17 = Normalize<float>((Vector3<float> *)auStack_38);
    fVar14 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar9._8_56_ = auVar13;
    if (*(float *)((long)&(this_00->image).p32.ptr + 4) <= fVar14) {
      auStack_38 = (undefined1  [8])vmovlps_avx(auVar9._0_16_);
      VStack_30.super_Tuple3<pbrt::Vector3,_float>.x = fVar14;
      PVar18 = Transform::operator()
                         ((Transform *)&(this_00->image).p32.nAlloc,(Point3<float> *)auStack_38);
      auVar10._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar10._8_56_ = auVar13;
      register0x00001200 = auVar10._0_16_;
      auStack_38 = (undefined1  [8])vmovlps_avx(register0x00001200);
      bVar3 = Inside<float>((Point2<float> *)auStack_38,
                            (Bounds2<float> *)((long)&(this_00->image).p16.nStored + 4));
      if (bVar3) {
        auStack_38 = (undefined1  [8])vmovlps_avx(stack0xffffffffffffffd8);
        FVar6 = PiecewiseConstant2D::PDF
                          ((PiecewiseConstant2D *)
                           (this_00[1].super_LightBase.renderFromLight.mInv.m + 1),
                           (Point2f *)auStack_38);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)((long)&(this_00->image).p16.nStored + 4);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = *(ulong *)((long)&(this_00->image).p32.alloc.memoryResource + 4);
        auVar15 = vsubps_avx(auVar16,auVar15);
        auVar7 = vmovshdup_avx(auVar15);
        *pdfDir = (FVar6 * auVar15._0_4_ * auVar7._0_4_) /
                  (fVar14 * fVar14 * fVar14 *
                  this_00[1].super_LightBase.renderFromLight.mInv.m[0][2]);
        return;
      }
    }
    *pdfDir = 0.0;
    return;
  }
  GoniometricLight::PDF_Le(this_00,ray,pdfPos,pdfDir);
  return;
}

Assistant:

PBRT_CPU_GPU
    TaggedPointer(const TaggedPointer &t) { bits = t.bits; }